

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

void __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
::remove<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Node *pNVar1;
  Comparison CVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Node *pNVar9;
  Node *pNVar10;
  void **head;
  Node *pNVar11;
  Top TVar12;
  Top local_50;
  Top local_40;
  
  local_40._inner._inner._0_8_ = key._inner._inner._0_8_;
  local_40._inner._inner._content[7] = key._inner._inner._content[7];
  uVar6 = this->_top - 1;
  pNVar9 = this->_left;
  do {
    pNVar10 = pNVar9->nodes[uVar6];
    if (pNVar10 == (Node *)0x0) {
      uVar6 = uVar6 - 1;
      pNVar10 = pNVar9;
      iVar8 = 3;
    }
    else {
      TVar12 = Kernel::TermList::top(&pNVar10->value->_term);
      local_50._inner._inner._0_8_ = TVar12._inner._inner._0_8_;
      local_50._inner._inner._content[7] = TVar12._inner._inner._content[7];
      CVar2 = Kernel::TermList::Top::compare(&local_40,&local_50);
      iVar8 = 0;
      if (CVar2 != GREATER) {
        if (CVar2 == EQUAL) {
          pNVar11 = pNVar10;
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            pNVar1 = pNVar10->nodes[0];
            if ((pNVar1 != (Node *)0x0) && (pNVar10->nodes[uVar6] != pNVar1)) {
              TVar12 = Kernel::TermList::top(&pNVar1->value->_term);
              local_50._inner._inner._0_8_ = TVar12._inner._inner._0_8_;
              local_50._inner._inner._content[7] = TVar12._inner._inner._content[7];
              CVar2 = Kernel::TermList::Top::compare(&local_40,&local_50);
              if (CVar2 == EQUAL) {
                pNVar11 = pNVar10->nodes[0];
                uVar6 = 0xffffffff;
                do {
                  uVar7 = uVar6 + 2;
                  uVar6 = uVar6 + 1;
                  pNVar9 = pNVar10;
                } while (pNVar11 == pNVar10->nodes[uVar7]);
              }
            }
          }
          uVar3 = (ulong)uVar6;
          pNVar9->nodes[uVar3] = pNVar11->nodes[uVar3];
          uVar4 = uVar3;
          if (uVar6 != 0) {
            do {
              uVar5 = uVar4 - 1;
              pNVar10 = pNVar9;
              do {
                pNVar9 = pNVar10;
                pNVar10 = pNVar9->nodes[uVar4 - 1];
              } while (pNVar9->nodes[uVar4 - 1] != pNVar11);
              pNVar9->nodes[uVar4 - 1] = pNVar11->nodes[uVar4 - 1];
              uVar4 = uVar5;
            } while (uVar5 != 0);
          }
          iVar8 = 1;
          uVar7 = 0;
          pNVar10 = pNVar9;
          uVar6 = 0;
          if (pNVar11 != (Node *)0x0) {
            uVar4 = uVar3 * 8 + 0x1f & 0xfffffffffffffff0;
            uVar6 = uVar7;
            if (uVar4 == 0) {
              pNVar11->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar11;
            }
            else if (uVar4 < 0x11) {
              pNVar11->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar11;
            }
            else if (uVar4 < 0x19) {
              pNVar11->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar11;
            }
            else if (uVar4 < 0x21) {
              pNVar11->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar11;
            }
            else if (uVar4 < 0x31) {
              pNVar11->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar11;
            }
            else if (uVar4 < 0x41) {
              pNVar11->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar11;
            }
            else {
              operator_delete(pNVar11,0x10);
            }
          }
        }
        else {
          pNVar10 = pNVar9;
          iVar8 = 0;
          if (CVar2 == LESS) {
            uVar6 = uVar6 - 1;
            iVar8 = 0;
          }
        }
      }
    }
    pNVar9 = pNVar10;
  } while ((iVar8 == 0) || (iVar8 == 3));
  return;
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }